

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::TargetCompare::operator()
          (TargetCompare *this,cmGeneratorTarget *l,cmGeneratorTarget *r)

{
  __type _Var1;
  bool bVar2;
  string *psVar3;
  string *__rhs;
  
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(r);
  _Var1 = std::operator==(psVar3,&this->First);
  if (_Var1) {
    bVar2 = false;
  }
  else {
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(l);
    _Var1 = std::operator==(psVar3,&this->First);
    bVar2 = true;
    if (!_Var1) {
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(l);
      __rhs = cmGeneratorTarget::GetName_abi_cxx11_(r);
      bVar2 = std::operator<(psVar3,__rhs);
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool cmGlobalGhsMultiGenerator::TargetCompare::operator()(
  cmGeneratorTarget const* l, cmGeneratorTarget const* r) const
{
  // Make sure a given named target is ordered first,
  // e.g. to set ALL_BUILD as the default active project.
  // When the empty string is named this is a no-op.
  if (r->GetName() == this->First) {
    return false;
  }
  if (l->GetName() == this->First) {
    return true;
  }
  return l->GetName() < r->GetName();
}